

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_backend.cpp
# Opt level: O0

void __thiscall basisu::basisu_backend::create_encoder_blocks(basisu_backend *this)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  params *ppVar4;
  basisu_backend_slice_desc *pbVar5;
  encoder_block *peVar6;
  pixel_block *pDst;
  anon_union_8_2_04352b30_for_etc_block_0 *paVar7;
  ulong uVar8;
  size_t siglen;
  undefined8 *in_RDI;
  size_t in_R8;
  float fVar9;
  char *pFmt;
  interval_timer *this_00;
  vector<unsigned_int> *this_01;
  uint32_t p_1;
  uint32_t p;
  uint64_t trial_err;
  color_rgba trial_colors [16];
  color_rgba pred_color;
  uint32_t pred_inten;
  uint32_t pred_endpoint_index;
  int pred_block_y_1;
  int pred_block_x_1;
  uint32_t endpoint_pred_1;
  uint32_t best_endpoint_index;
  uint64_t best_err;
  etc_block trial_etc_block;
  uint64_t thresh_err;
  uint64_t cur_err;
  etc_block etc_blk;
  pixel_block *src_pixels;
  uint32_t pred_endpoint;
  int pred_block_y;
  int pred_block_x;
  uint32_t prev_selector;
  uint32_t prev_endpoint;
  uint32_t cur_selector;
  uint32_t cur_endpoint;
  uint32_t endpoint_pred;
  uint32_t best_endpoint_pred;
  uint32_t block_endpoint;
  encoder_block *m;
  uint32_t block_index;
  uint32_t block_x;
  uint32_t block_y;
  uint32_t num_blocks_y;
  uint32_t num_blocks_x;
  uint32_t first_block_index;
  bool is_iframe;
  int prev_frame_slice_index;
  uint32_t slice_index;
  uint_vec all_endpoint_indices;
  uint32_t total_block_endpoints_remapped;
  uint32_t total_endpoint_pred_hits;
  uint32_t total_endpoint_pred_missed;
  bool is_video;
  basisu_frontend *r;
  interval_timer tm;
  uint32_t in_stack_fffffffffffffcf8;
  uint32_t in_stack_fffffffffffffcfc;
  basisu_frontend *in_stack_fffffffffffffd00;
  uint *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  uint uVar10;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  etc_block *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  uint uVar11;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  uint32_t in_stack_fffffffffffffd40;
  uint32_t in_stack_fffffffffffffd44;
  vector2D<basisu::encoder_block> *in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd50;
  uint32_t in_stack_fffffffffffffd54;
  color_rgba *in_stack_fffffffffffffd70;
  color_rgba *in_stack_fffffffffffffd78;
  anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1 *in_stack_fffffffffffffd80
  ;
  float local_254;
  encoder_block *in_stack_fffffffffffffdd8;
  basisu_backend *in_stack_fffffffffffffe60;
  int local_180;
  uint local_148;
  uint local_144;
  ulong local_140;
  color_rgba local_138 [6];
  uint_vec *in_stack_fffffffffffffee0;
  uint32_t in_stack_fffffffffffffeec;
  basisu_backend *in_stack_fffffffffffffef0;
  color_rgba cStack_f8;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_f4;
  uint32_t local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  uint local_e0;
  int local_dc;
  ulong local_d8;
  anon_union_8_2_04352b30_for_etc_block_0 local_d0;
  ulong local_c8;
  uint64_t local_c0;
  anon_union_8_2_04352b30_for_etc_block_0 local_b8;
  pixel_block *local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  uint local_8c;
  uint32_t local_88;
  int local_84;
  encoder_block *local_80;
  int local_78;
  uint local_74;
  uint local_70;
  uint32_t local_6c;
  uint32_t local_68;
  uint32_t local_64;
  byte local_5d;
  int local_5c;
  uint local_58;
  vector<unsigned_int> local_48;
  uint local_38;
  uint local_34;
  uint local_30;
  byte local_29;
  basisu_frontend *local_28;
  
  debug_printf("basisu_backend::create_encoder_blocks\n");
  interval_timer::interval_timer((interval_timer *)0x4931e9);
  interval_timer::start((interval_timer *)in_stack_fffffffffffffd00);
  local_28 = (basisu_frontend *)*in_RDI;
  ppVar4 = basisu_frontend::get_params(local_28);
  local_29 = ppVar4->m_tex_type == cBASISTexTypeVideoFrames;
  vector<basisu::basisu_backend_slice_desc>::size
            ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 4));
  vector<basisu::vector2D<basisu::encoder_block>_>::resize
            ((vector<basisu::vector2D<basisu::encoder_block>_> *)
             CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
             (size_t)in_stack_fffffffffffffd08,SUB81((ulong)in_stack_fffffffffffffd00 >> 0x38,0));
  local_30 = 0;
  local_34 = 0;
  local_38 = 0;
  vector<unsigned_int>::vector(&local_48);
  get_total_blocks((basisu_backend *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
  vector<unsigned_int>::reserve
            ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
             CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
  local_58 = 0;
  do {
    uVar10 = local_58;
    uVar2 = vector<basisu::basisu_backend_slice_desc>::size
                      ((vector<basisu::basisu_backend_slice_desc> *)(in_RDI + 4));
    uVar1 = local_30;
    if (uVar2 <= uVar10) {
      uVar8 = (ulong)local_30;
      uVar2 = get_total_blocks((basisu_backend *)
                               CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
      pFmt = (char *)(double)(((float)uVar8 * 100.0) / (float)uVar2);
      fVar9 = (float)local_34 * 100.0;
      uVar11 = local_34;
      uVar2 = get_total_blocks((basisu_backend *)
                               CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
      this_00 = (interval_timer *)(double)(fVar9 / (float)uVar2);
      fVar9 = (float)local_38 * 100.0;
      uVar10 = local_38;
      uVar2 = get_total_blocks((basisu_backend *)CONCAT44(local_38,in_stack_fffffffffffffd10));
      debug_printf(pFmt,this_00,(double)(fVar9 / (float)uVar2),
                   "total_endpoint_pred_missed: %u (%3.2f%%) total_endpoint_pred_hit: %u (%3.2f%%), total_block_endpoints_remapped: %u (%3.2f%%)\n"
                   ,(ulong)uVar1,(ulong)uVar11,(ulong)uVar10);
      reoptimize_and_sort_endpoints_codebook
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee0);
      sort_selector_codebook(in_stack_fffffffffffffe60);
      check_for_valid_cr_blocks
                ((basisu_backend *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
      this_01 = (vector<unsigned_int> *)interval_timer::get_elapsed_secs(this_00);
      debug_printf((char *)this_01,"Elapsed time: %3.3f secs\n");
      vector<unsigned_int>::~vector(this_01);
      return;
    }
    if ((local_29 & 1) == 0) {
      local_180 = -1;
    }
    else {
      local_180 = find_video_frame((basisu_backend *)
                                   CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                                   (int)((ulong)in_stack_fffffffffffffd20 >> 0x20),
                                   (int)in_stack_fffffffffffffd20);
    }
    local_5c = local_180;
    pbVar5 = vector<basisu::basisu_backend_slice_desc>::operator[]
                       ((vector<basisu::basisu_backend_slice_desc> *)in_stack_fffffffffffffd00,
                        CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    local_5d = pbVar5->m_iframe & 1;
    pbVar5 = vector<basisu::basisu_backend_slice_desc>::operator[]
                       ((vector<basisu::basisu_backend_slice_desc> *)in_stack_fffffffffffffd00,
                        CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    local_64 = pbVar5->m_first_block_index;
    pbVar5 = vector<basisu::basisu_backend_slice_desc>::operator[]
                       ((vector<basisu::basisu_backend_slice_desc> *)in_stack_fffffffffffffd00,
                        CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    local_68 = pbVar5->m_num_blocks_x;
    in_stack_fffffffffffffe60 =
         (basisu_backend *)
         vector<basisu::basisu_backend_slice_desc>::operator[]
                   ((vector<basisu::basisu_backend_slice_desc> *)in_stack_fffffffffffffd00,
                    CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    local_6c._0_1_ = (in_stack_fffffffffffffe60->m_params).m_used_global_codebooks;
    local_6c._1_1_ = (in_stack_fffffffffffffe60->m_params).m_validate;
    local_6c._2_2_ = *(undefined2 *)&(in_stack_fffffffffffffe60->m_params).field_0x12;
    vector<basisu::vector2D<basisu::encoder_block>_>::operator[]
              ((vector<basisu::vector2D<basisu::encoder_block>_> *)in_stack_fffffffffffffd00,
               CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    vector2D<basisu::encoder_block>::resize
              (in_stack_fffffffffffffd48,in_stack_fffffffffffffd44,in_stack_fffffffffffffd40);
    for (local_70 = 0; local_70 < local_6c; local_70 = local_70 + 1) {
      for (local_74 = 0; local_74 < local_68; local_74 = local_74 + 1) {
        local_78 = local_64 + local_74 + local_70 * local_68;
        vector<basisu::vector2D<basisu::encoder_block>_>::operator[]
                  ((vector<basisu::vector2D<basisu::encoder_block>_> *)in_stack_fffffffffffffd00,
                   CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        local_80 = vector2D<basisu::encoder_block>::operator()
                             ((vector2D<basisu::encoder_block> *)
                              CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                              (uint32_t)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                              (uint32_t)in_stack_fffffffffffffd08);
        uVar2 = basisu_frontend::get_subblock_endpoint_cluster_index
                          (in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                           in_stack_fffffffffffffcf8);
        local_80->m_endpoint_index = uVar2;
        uVar2 = basisu_frontend::get_subblock_endpoint_cluster_index
                          (in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                           in_stack_fffffffffffffcf8);
        uVar3 = basisu_frontend::get_subblock_endpoint_cluster_index
                          (in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                           in_stack_fffffffffffffcf8);
        verify((EVP_PKEY_CTX *)(ulong)(uVar2 == uVar3),(uchar *)0x1bd,siglen,(uchar *)(ulong)uVar3,
               in_R8);
        uVar2 = basisu_frontend::get_block_selector_cluster_index
                          (in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc);
        local_80->m_selector_index = uVar2;
        local_80->m_endpoint_predictor = 3;
        local_84 = local_80->m_endpoint_index;
        local_88 = 0xffffffff;
        for (local_8c = 0; local_8c < 3; local_8c = local_8c + 1) {
          if (((local_29 & 1) == 0) || (local_8c != 2)) {
            local_a0 = local_74 + (int)*(char *)((long)&g_endpoint_preds + (ulong)local_8c * 2);
            if ((-1 < local_a0) &&
               (((local_a0 < (int)local_68 &&
                 (local_a4 = local_70 +
                             (int)*(char *)((long)&g_endpoint_preds + (ulong)local_8c * 2 + 1),
                 -1 < local_a4)) && (local_a4 < (int)local_6c)))) {
              vector<basisu::vector2D<basisu::encoder_block>_>::operator[]
                        ((vector<basisu::vector2D<basisu::encoder_block>_> *)
                         in_stack_fffffffffffffd00,
                         CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
              in_stack_fffffffffffffdd8 =
                   vector2D<basisu::encoder_block>::operator()
                             ((vector2D<basisu::encoder_block> *)
                              CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                              (uint32_t)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                              (uint32_t)in_stack_fffffffffffffd08);
              local_a8 = in_stack_fffffffffffffdd8->m_endpoint_index;
              if ((local_a8 == local_84) && (local_8c < local_88)) {
                local_88 = local_8c;
              }
            }
          }
          else if ((local_5c != -1) && ((local_5d & 1) == 0)) {
            vector<basisu::vector2D<basisu::encoder_block>_>::operator[]
                      ((vector<basisu::vector2D<basisu::encoder_block>_> *)in_stack_fffffffffffffd00
                       ,CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
            peVar6 = vector2D<basisu::encoder_block>::operator()
                               ((vector2D<basisu::encoder_block> *)
                                CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                                (uint32_t)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                                (uint32_t)in_stack_fffffffffffffd08);
            local_90 = peVar6->m_endpoint_index;
            vector<basisu::vector2D<basisu::encoder_block>_>::operator[]
                      ((vector<basisu::vector2D<basisu::encoder_block>_> *)in_stack_fffffffffffffd00
                       ,CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
            peVar6 = vector2D<basisu::encoder_block>::operator()
                               ((vector2D<basisu::encoder_block> *)
                                CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                                (uint32_t)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                                (uint32_t)in_stack_fffffffffffffd08);
            local_94 = peVar6->m_selector_index;
            vector<basisu::vector2D<basisu::encoder_block>_>::operator[]
                      ((vector<basisu::vector2D<basisu::encoder_block>_> *)in_stack_fffffffffffffd00
                       ,CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
            peVar6 = vector2D<basisu::encoder_block>::operator()
                               ((vector2D<basisu::encoder_block> *)
                                CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                                (uint32_t)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                                (uint32_t)in_stack_fffffffffffffd08);
            local_98 = peVar6->m_endpoint_index;
            vector<basisu::vector2D<basisu::encoder_block>_>::operator[]
                      ((vector<basisu::vector2D<basisu::encoder_block>_> *)in_stack_fffffffffffffd00
                       ,CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
            peVar6 = vector2D<basisu::encoder_block>::operator()
                               ((vector2D<basisu::encoder_block> *)
                                CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                                (uint32_t)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                                (uint32_t)in_stack_fffffffffffffd08);
            local_9c = peVar6->m_selector_index;
            if ((local_90 == local_98) && (local_94 == local_9c)) {
              local_88 = 2;
              vector<basisu::vector2D<basisu::encoder_block>_>::operator[]
                        ((vector<basisu::vector2D<basisu::encoder_block>_> *)
                         in_stack_fffffffffffffd00,
                         CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
              peVar6 = vector2D<basisu::encoder_block>::operator()
                                 ((vector2D<basisu::encoder_block> *)
                                  CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                                  (uint32_t)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                                  (uint32_t)in_stack_fffffffffffffd08);
              peVar6->m_is_cr_target = true;
            }
          }
        }
        if (local_88 == 0xffffffff) {
          if (*(float *)((long)in_RDI + 0xc) <= 0.0) {
            local_30 = local_30 + 1;
          }
          else {
            pDst = basisu_frontend::get_source_pixel_block
                             (in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc);
            local_b0 = pDst;
            paVar7 = &basisu_frontend::get_output_block
                                (in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc)->field_0;
            local_b8 = *paVar7;
            pixel_block::get_ptr(local_b0);
            basisu_frontend::get_params(local_28);
            local_c0 = etc_block::evaluate_etc1_error
                                 ((etc_block *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                                  SUB81((ulong)in_stack_fffffffffffffd70 >> 0x38,0),
                                  (int)in_stack_fffffffffffffd70);
            if (local_c0 != 0) {
              local_254 = (float)local_c0;
              fVar9 = maximum<float>(1.0,*(float *)((long)in_RDI + 0xc));
              local_c8 = (ulong)(local_254 * fVar9);
              local_c8 = local_c8 |
                         (long)(local_254 * fVar9 - 9.223372e+18) & (long)local_c8 >> 0x3f;
              local_d0 = local_b8;
              local_d8 = 0xffffffffffffffff;
              local_dc = 0;
              local_88 = 0xffffffff;
              for (local_e0 = 0; local_e0 < 3; local_e0 = local_e0 + 1) {
                if ((((((local_29 & 1) == 0) || (local_e0 != 2)) &&
                     (local_e4 = local_74 +
                                 (int)*(char *)((long)&g_endpoint_preds + (ulong)local_e0 * 2),
                     -1 < local_e4)) &&
                    ((local_e4 < (int)local_68 &&
                     (local_e8 = local_70 +
                                 (int)*(char *)((long)&g_endpoint_preds + (ulong)local_e0 * 2 + 1),
                     -1 < local_e8)))) && (local_e8 < (int)local_6c)) {
                  vector<basisu::vector2D<basisu::encoder_block>_>::operator[]
                            ((vector<basisu::vector2D<basisu::encoder_block>_> *)
                             in_stack_fffffffffffffd00,
                             CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
                  peVar6 = vector2D<basisu::encoder_block>::operator()
                                     ((vector2D<basisu::encoder_block> *)
                                      CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                                      (uint32_t)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                                      (uint32_t)in_stack_fffffffffffffd08);
                  local_ec = peVar6->m_endpoint_index;
                  local_f0 = basisu_frontend::get_endpoint_cluster_inten_table
                                       (in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                                        SUB41(in_stack_fffffffffffffcf8 >> 0x18,0));
                  in_stack_fffffffffffffd80 =
                       (anon_struct_4_4_d83cdc77_for_anon_union_4_2_6eba8969_for_color_rgba_0_1 *)
                       basisu_frontend::get_endpoint_cluster_unscaled_color
                                 (in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,
                                  SUB41(in_stack_fffffffffffffcf8 >> 0x18,0));
                  local_f4.field_1 = *in_stack_fffffffffffffd80;
                  etc_block::set_block_color5
                            (in_stack_fffffffffffffd20,
                             (color_rgba *)
                             CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                             (color_rgba *)
                             CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
                  etc_block::set_inten_table
                            ((etc_block *)
                             CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                             (uint32_t)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                             (uint32_t)in_stack_fffffffffffffd08);
                  etc_block::set_inten_table
                            ((etc_block *)
                             CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                             (uint32_t)((ulong)in_stack_fffffffffffffd08 >> 0x20),
                             (uint32_t)in_stack_fffffffffffffd08);
                  in_stack_fffffffffffffd78 = local_138;
                  in_stack_fffffffffffffd70 = &cStack_f8;
                  do {
                    color_rgba::color_rgba(in_stack_fffffffffffffd78);
                    in_stack_fffffffffffffd78 = in_stack_fffffffffffffd78 + 1;
                  } while (in_stack_fffffffffffffd78 != in_stack_fffffffffffffd70);
                  unpack_etc1((etc_block *)in_stack_fffffffffffffdd8,(color_rgba *)pDst,
                              SUB81((ulong)paVar7 >> 0x38,0));
                  local_140 = 0;
                  ppVar4 = basisu_frontend::get_params(local_28);
                  if ((ppVar4->m_perceptual & 1U) == 0) {
                    for (local_148 = 0; local_148 < 0x10; local_148 = local_148 + 1) {
                      in_stack_fffffffffffffd48 =
                           (vector2D<basisu::encoder_block> *)pixel_block::get_ptr(local_b0);
                      in_stack_fffffffffffffd44 =
                           color_distance(SUB41((uint)in_stack_fffffffffffffd30 >> 0x18,0),
                                          (color_rgba *)
                                          CONCAT44(in_stack_fffffffffffffd2c,
                                                   in_stack_fffffffffffffd28),
                                          (color_rgba *)in_stack_fffffffffffffd20,
                                          SUB41((uint)in_stack_fffffffffffffd1c >> 0x18,0));
                      local_140 = in_stack_fffffffffffffd44 + local_140;
                      if (local_c8 < local_140) break;
                    }
                  }
                  else {
                    for (local_144 = 0; local_144 < 0x10; local_144 = local_144 + 1) {
                      pixel_block::get_ptr(local_b0);
                      in_stack_fffffffffffffd54 =
                           color_distance(SUB41((uint)in_stack_fffffffffffffd30 >> 0x18,0),
                                          (color_rgba *)
                                          CONCAT44(in_stack_fffffffffffffd2c,
                                                   in_stack_fffffffffffffd28),
                                          (color_rgba *)in_stack_fffffffffffffd20,
                                          SUB41((uint)in_stack_fffffffffffffd1c >> 0x18,0));
                      local_140 = in_stack_fffffffffffffd54 + local_140;
                      if (local_c8 < local_140) break;
                    }
                  }
                  if ((local_140 <= local_c8) &&
                     ((local_140 < local_d8 || ((local_140 == local_d8 && (local_e0 < local_88))))))
                  {
                    local_88 = local_e0;
                    local_d8 = local_140;
                    local_dc = local_ec;
                  }
                }
              }
              if (local_88 == 0xffffffff) {
                local_30 = local_30 + 1;
              }
              else {
                local_80->m_endpoint_index = local_dc;
                local_80->m_endpoint_predictor = local_88;
                local_34 = local_34 + 1;
                local_38 = local_38 + 1;
              }
            }
          }
        }
        else {
          local_80->m_endpoint_predictor = local_88;
          local_34 = local_34 + 1;
        }
        if (local_80->m_endpoint_predictor == 3) {
          vector<unsigned_int>::push_back
                    ((vector<unsigned_int> *)
                     CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     in_stack_fffffffffffffd08);
        }
      }
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

void basisu_backend::create_encoder_blocks()
	{
		debug_printf("basisu_backend::create_encoder_blocks\n");

		interval_timer tm;
		tm.start();

		basisu_frontend& r = *m_pFront_end;
		const bool is_video = r.get_params().m_tex_type == basist::cBASISTexTypeVideoFrames;

		m_slice_encoder_blocks.resize(m_slices.size());

		uint32_t total_endpoint_pred_missed = 0, total_endpoint_pred_hits = 0, total_block_endpoints_remapped = 0;

		uint_vec all_endpoint_indices;
		all_endpoint_indices.reserve(get_total_blocks());

		for (uint32_t slice_index = 0; slice_index < m_slices.size(); slice_index++)
		{
			const int prev_frame_slice_index = is_video ? find_video_frame(slice_index, -1) : -1;
			const bool is_iframe = m_slices[slice_index].m_iframe;
			const uint32_t first_block_index = m_slices[slice_index].m_first_block_index;

			//const uint32_t width = m_slices[slice_index].m_width;
			//const uint32_t height = m_slices[slice_index].m_height;
			const uint32_t num_blocks_x = m_slices[slice_index].m_num_blocks_x;
			const uint32_t num_blocks_y = m_slices[slice_index].m_num_blocks_y;

			m_slice_encoder_blocks[slice_index].resize(num_blocks_x, num_blocks_y);

			for (uint32_t block_y = 0; block_y < num_blocks_y; block_y++)
			{
				for (uint32_t block_x = 0; block_x < num_blocks_x; block_x++)
				{
					const uint32_t block_index = first_block_index + block_x + block_y * num_blocks_x;

					encoder_block& m = m_slice_encoder_blocks[slice_index](block_x, block_y);

					m.m_endpoint_index = r.get_subblock_endpoint_cluster_index(block_index, 0);
					BASISU_BACKEND_VERIFY(r.get_subblock_endpoint_cluster_index(block_index, 0) == r.get_subblock_endpoint_cluster_index(block_index, 1));

					m.m_selector_index = r.get_block_selector_cluster_index(block_index);

					m.m_endpoint_predictor = basist::NO_ENDPOINT_PRED_INDEX;

					const uint32_t block_endpoint = m.m_endpoint_index;

					uint32_t best_endpoint_pred = UINT32_MAX;

					for (uint32_t endpoint_pred = 0; endpoint_pred < basist::NUM_ENDPOINT_PREDS; endpoint_pred++)
					{
						if ((is_video) && (endpoint_pred == basist::CR_ENDPOINT_PRED_INDEX))
						{
							if ((prev_frame_slice_index != -1) && (!is_iframe))
							{
								const uint32_t cur_endpoint = m_slice_encoder_blocks[slice_index](block_x, block_y).m_endpoint_index;
								const uint32_t cur_selector = m_slice_encoder_blocks[slice_index](block_x, block_y).m_selector_index;
								const uint32_t prev_endpoint = m_slice_encoder_blocks[prev_frame_slice_index](block_x, block_y).m_endpoint_index;
								const uint32_t prev_selector = m_slice_encoder_blocks[prev_frame_slice_index](block_x, block_y).m_selector_index;
								if ((cur_endpoint == prev_endpoint) && (cur_selector == prev_selector))
								{
									best_endpoint_pred = basist::CR_ENDPOINT_PRED_INDEX;
									m_slice_encoder_blocks[prev_frame_slice_index](block_x, block_y).m_is_cr_target = true;
								}
							}
						}
						else
						{
							int pred_block_x = block_x + g_endpoint_preds[endpoint_pred].m_dx;
							if ((pred_block_x < 0) || (pred_block_x >= (int)num_blocks_x))
								continue;

							int pred_block_y = block_y + g_endpoint_preds[endpoint_pred].m_dy;
							if ((pred_block_y < 0) || (pred_block_y >= (int)num_blocks_y))
								continue;

							uint32_t pred_endpoint = m_slice_encoder_blocks[slice_index](pred_block_x, pred_block_y).m_endpoint_index;

							if (pred_endpoint == block_endpoint)
							{
								if (endpoint_pred < best_endpoint_pred)
								{
									best_endpoint_pred = endpoint_pred;
								}
							}
						}

					} // endpoint_pred

					if (best_endpoint_pred != UINT32_MAX)
					{
						m.m_endpoint_predictor = best_endpoint_pred;

						total_endpoint_pred_hits++;
					}
					else if (m_params.m_endpoint_rdo_quality_thresh > 0.0f)
					{
						const pixel_block& src_pixels = r.get_source_pixel_block(block_index);

						etc_block etc_blk(r.get_output_block(block_index));

						uint64_t cur_err = etc_blk.evaluate_etc1_error(src_pixels.get_ptr(), r.get_params().m_perceptual);

						if (cur_err)
						{
							const uint64_t thresh_err = (uint64_t)(cur_err * maximum(1.0f, m_params.m_endpoint_rdo_quality_thresh));

							etc_block trial_etc_block(etc_blk);

							uint64_t best_err = UINT64_MAX;
							uint32_t best_endpoint_index = 0;

							best_endpoint_pred = UINT32_MAX;

							for (uint32_t endpoint_pred = 0; endpoint_pred < basist::NUM_ENDPOINT_PREDS; endpoint_pred++)
							{
								if ((is_video) && (endpoint_pred == basist::CR_ENDPOINT_PRED_INDEX))
									continue;

								int pred_block_x = block_x + g_endpoint_preds[endpoint_pred].m_dx;
								if ((pred_block_x < 0) || (pred_block_x >= (int)num_blocks_x))
									continue;

								int pred_block_y = block_y + g_endpoint_preds[endpoint_pred].m_dy;
								if ((pred_block_y < 0) || (pred_block_y >= (int)num_blocks_y))
									continue;

								uint32_t pred_endpoint_index = m_slice_encoder_blocks[slice_index](pred_block_x, pred_block_y).m_endpoint_index;

								uint32_t pred_inten = r.get_endpoint_cluster_inten_table(pred_endpoint_index, false);
								color_rgba pred_color = r.get_endpoint_cluster_unscaled_color(pred_endpoint_index, false);

								trial_etc_block.set_block_color5(pred_color, pred_color);
								trial_etc_block.set_inten_table(0, pred_inten);
								trial_etc_block.set_inten_table(1, pred_inten);

								color_rgba trial_colors[16];
								unpack_etc1(trial_etc_block, trial_colors);

								uint64_t trial_err = 0;
								if (r.get_params().m_perceptual)
								{
									for (uint32_t p = 0; p < 16; p++)
									{
										trial_err += color_distance(true, src_pixels.get_ptr()[p], trial_colors[p], false);
										if (trial_err > thresh_err)
											break;
									}
								}
								else
								{
									for (uint32_t p = 0; p < 16; p++)
									{
										trial_err += color_distance(false, src_pixels.get_ptr()[p], trial_colors[p], false);
										if (trial_err > thresh_err)
											break;
									}
								}

								if (trial_err <= thresh_err)
								{
									if ((trial_err < best_err) || ((trial_err == best_err) && (endpoint_pred < best_endpoint_pred)))
									{
										best_endpoint_pred = endpoint_pred;
										best_err = trial_err;
										best_endpoint_index = pred_endpoint_index;
									}
								}
							} // endpoint_pred

							if (best_endpoint_pred != UINT32_MAX)
							{
								m.m_endpoint_index = best_endpoint_index;
								m.m_endpoint_predictor = best_endpoint_pred;

								total_endpoint_pred_hits++;
								total_block_endpoints_remapped++;
							}
							else
							{
								total_endpoint_pred_missed++;
							}
						}
					}
					else
					{
						total_endpoint_pred_missed++;
					}

					if (m.m_endpoint_predictor == basist::NO_ENDPOINT_PRED_INDEX)
					{
						all_endpoint_indices.push_back(m.m_endpoint_index);
					}

				} // block_x

			} // block_y

		} // slice

		debug_printf("total_endpoint_pred_missed: %u (%3.2f%%) total_endpoint_pred_hit: %u (%3.2f%%), total_block_endpoints_remapped: %u (%3.2f%%)\n",
			total_endpoint_pred_missed, total_endpoint_pred_missed * 100.0f / get_total_blocks(),
			total_endpoint_pred_hits, total_endpoint_pred_hits * 100.0f / get_total_blocks(),
			total_block_endpoints_remapped, total_block_endpoints_remapped * 100.0f / get_total_blocks());

		reoptimize_and_sort_endpoints_codebook(total_block_endpoints_remapped, all_endpoint_indices);

		sort_selector_codebook();
		check_for_valid_cr_blocks();
		
		debug_printf("Elapsed time: %3.3f secs\n", tm.get_elapsed_secs());
	}